

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_idifference(LispPTR tosm1,LispPTR tos)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = (ulong)tos;
  uVar2 = (ulong)tosm1;
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    uVar6 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    uVar6 = tosm1 & 0xffff;
  }
  else {
    uVar3 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      if (*(float *)(Lisp_world + uVar2) != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar6 = (uint)*(float *)(Lisp_world + uVar2);
    }
    else {
      if (uVar3 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      uVar6 = *(uint *)(Lisp_world + uVar2);
    }
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar4 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar4 = tos & 0xffff;
  }
  else {
    uVar3 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      if (*(float *)(Lisp_world + uVar1) != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar4 = (uint)*(float *)(Lisp_world + uVar1);
    }
    else {
      if (uVar3 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      uVar4 = *(uint *)(Lisp_world + uVar1);
    }
  }
  uVar7 = uVar6 - uVar4;
  if (SBORROW4(uVar6,uVar4)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  if ((uVar7 & 0xffff0000) != 0xffff0000) {
    if ((uVar7 & 0xffff0000) != 0) {
      puVar5 = (uint *)createcell68k(2);
      *puVar5 = uVar7;
      if (((ulong)puVar5 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar5);
      }
      return (LispPTR)((ulong)((long)puVar5 - (long)Lisp_world) >> 1);
    }
    return uVar7 | 0xe0000;
  }
  return uVar7 & 0xffff | 0xf0000;
}

Assistant:

LispPTR N_OP_idifference(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_ssub_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: -2147483647 - 100 cannot be represented in type 'int' */
  result = arg1 - arg2;
  if (((arg1 >= 0) == (arg2 < 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif
doufn:
  ERROR_EXIT(tos);
}